

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.cpp
# Opt level: O3

void __thiscall CJobPool::Shutdown(CJobPool *this)

{
  long lVar1;
  
  if (this->m_Shutdown != false) {
    return;
  }
  this->m_Shutdown = true;
  if (0 < this->m_NumThreads) {
    lVar1 = 0;
    do {
      thread_wait(this->m_apThreads[lVar1]);
      thread_destroy(this->m_apThreads[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->m_NumThreads);
  }
  lock_destroy(this->m_Lock);
  return;
}

Assistant:

void CJobPool::Shutdown()
{
	if(m_Shutdown)
		return;

	m_Shutdown = true;
	for(int i = 0; i < m_NumThreads; i++)
	{
		thread_wait(m_apThreads[i]);
		thread_destroy(m_apThreads[i]);
	}
	lock_destroy(m_Lock);
}